

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O2

Result __thiscall
tonk::SessionIncoming::onSiameseSolved(SessionIncoming *this,SiameseOriginalPacket *packet)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  RefCounter *pRVar5;
  long in_RDX;
  Result *success;
  uint uVar6;
  allocator local_49;
  string local_48 [32];
  
  lVar3 = *(long *)(in_RDX + 8);
  uVar2 = *(uint *)(in_RDX + 4);
  uVar6 = 0;
  do {
    if (uVar2 - uVar6 < 2) {
      if (uVar2 == uVar6) {
        (this->Deps).ConnectionRef = (RefCounter *)0x0;
      }
      else {
        std::__cxx11::string::string(local_48,"Invalid frame",&local_49);
        pRVar5 = (RefCounter *)operator_new(0x38);
        *(char **)pRVar5 = "SessionIncoming::onSiameseSolved";
        std::__cxx11::string::string((string *)&pRVar5->ShutdownJson,local_48);
LAB_00151c2e:
        (pRVar5->RefCount).super___atomic_base<int>._M_i = 0;
        (pRVar5->ShutdownLock).super___mutex_base._M_mutex.__align = 9;
        (this->Deps).ConnectionRef = pRVar5;
        std::__cxx11::string::~string(local_48);
      }
      return (Result)(ErrorResult *)this;
    }
    uVar1 = *(ushort *)(lVar3 + (ulong)uVar6);
    iVar4 = uVar6 + 2;
    uVar6 = uVar1 & 0x7ff;
    if (uVar2 - iVar4 < uVar6) {
      std::__cxx11::string::string(local_48,"Truncated message",&local_49);
      pRVar5 = (RefCounter *)operator_new(0x38);
      *(char **)pRVar5 = "SessionIncoming::onSiameseSolved";
      std::__cxx11::string::string((string *)&pRVar5->ShutdownJson,local_48);
      goto LAB_00151c2e;
    }
    uVar1 = uVar1 >> 0xb;
    uVar6 = uVar6 + iVar4;
    if ((uVar1 == 0x1f) || (uVar1 == 3)) {
      deliverMessage(this,(uint)packet,(uint8_t *)(ulong)uVar1,iVar4 + (int)lVar3);
      if ((this->Deps).ConnectionRef != (RefCounter *)0x0) {
        return (Result)(ErrorResult *)this;
      }
      Result::~Result((Result *)this);
    }
  } while( true );
}

Assistant:

Result SessionIncoming::onSiameseSolved(const SiameseOriginalPacket& packet)
{
    siamese::ReadByteStream frameReader(packet.Data, packet.DataBytes);

    // Process all messages contained in the datagram:
    while (frameReader.Remaining() >= protocol::kMessageFrameBytes)
    {
        // Read message frame header
        unsigned messageType = frameReader.Read16();
        const unsigned messageBytes = messageType & protocol::kMessageLengthMask;

        if (frameReader.Remaining() < messageBytes)
        {
            TONK_DEBUG_BREAK();
            return Result("SessionIncoming::onSiameseSolved", "Truncated message", ErrorType::Tonk, Tonk_InvalidData);
        }

        messageType >>= protocol::kMessageLengthBits;
        const uint8_t* messageData = frameReader.Read(messageBytes);

        // Unordered and unreliable data can be processed after Siamese solves
        // the recovery problem
        if (messageType == protocol::MessageType_Unordered ||
            messageType == protocol::MessageType_Unreliable)
        {
            TONK_VERBOSE_INCOMING_LOG("Deliver onSiameseSolved unordered(", packet.PacketNum, ") message: messageType=", messageType, " messageBytes=", messageBytes);

            const Result result = deliverMessage(messageType, messageData, messageBytes);
            if (result.IsFail()) {
                return result;
            }
        }
    }

    // If the message payload was not completely used:
    if (frameReader.Remaining() > 0)
    {
        TONK_DEBUG_BREAK(); // Invalid data
        return Result("SessionIncoming::onSiameseSolved", "Invalid frame", ErrorType::Tonk, Tonk_InvalidData);
    }

    return Result::Success();
}